

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void libcellml::flattenComponentImports
               (ComponentEntityPtr *parent,ComponentPtr *component,size_t componentIndex)

{
  size_t sVar1;
  ulong componentIndex_00;
  ComponentPtr flattenedComponent;
  ComponentPtr c;
  ComponentEntityPtr local_50;
  ComponentEntityPtr local_40;
  ComponentEntity local_30;
  
  flattenComponent(&local_50,(ComponentPtr *)parent,(size_t)component);
  componentIndex_00 = 0;
  while( true ) {
    sVar1 = ComponentEntity::componentCount
                      (local_50.
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar1 <= componentIndex_00) break;
    ComponentEntity::component
              (&local_30,
               (size_t)local_50.
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    local_40.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    flattenComponentImports(&local_40,(ComponentPtr *)&local_30,componentIndex_00);
    if (local_40.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_30.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_30.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
    componentIndex_00 = componentIndex_00 + 1;
  }
  if (local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void flattenComponentImports(const ComponentEntityPtr &parent, ComponentPtr &component, size_t componentIndex)
{
    auto flattenedComponent = flattenComponent(parent, component, componentIndex);
    for (size_t index = 0; index < flattenedComponent->componentCount(); ++index) {
        auto c = flattenedComponent->component(index);
        flattenComponentImports(flattenedComponent, c, index);
    }
}